

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_tobin.c
# Opt level: O2

int cfg_tobin_int(void *reference,size_t bin_size,const_strarray *value,uint16_t fraction,
                 size_t int_size)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  bool bVar4;
  int64_t i;
  
  iVar1 = -1;
  if (bin_size == int_size) {
    uVar3 = (ulong)fraction;
    lVar2 = 1;
    while (bVar4 = uVar3 != 0, uVar3 = uVar3 - 1, bVar4) {
      lVar2 = lVar2 * 10;
    }
    iVar1 = isonumber_to_s64(&i,value->value,lVar2);
    if (iVar1 == 0) {
      if (bin_size == 8) {
        *(ulong *)reference = CONCAT44(i._4_4_,(undefined4)i);
      }
      else {
        if (bin_size != 4) {
          return -1;
        }
        *(undefined4 *)reference = (undefined4)i;
      }
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int
cfg_tobin_int(void *reference, size_t bin_size, const struct const_strarray *value, uint16_t fraction, size_t int_size) {
  int64_t i;
  int result;
  uint64_t j, scaling;

  if (bin_size != int_size) {
    return -1;
  }

  for (j = 0, scaling = 1; j < fraction; j++, scaling*=10);

  result = isonumber_to_s64(&i, strarray_get_first_c(value), scaling);
  if (result == 0) {
    switch (int_size) {
      case 4:
        *((int32_t *)reference) = i;
        break;
      case 8:
        *((int64_t *)reference) = i;
        break;
      default:
        return -1;
    }
  }
  return result;
}